

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsStrategy.cpp
# Opt level: O1

optional<Vault::AuthenticationResponse> * __thiscall
Vault::TlsStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,TlsStrategy *this,
          Client *client)

{
  Url local_40;
  
  getUrl_abi_cxx11_(&local_40,(TlsStrategy *)client,client);
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_40,&this->cert_,&this->key_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
    operator_delete(local_40.value_._M_dataplus._M_p,
                    local_40.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::TlsStrategy::authenticate(const Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client), cert_, key_);
}